

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O2

Node * __thiscall
dynet::ScalarInputNode::autobatch_pseudo_node
          (ScalarInputNode *this,ComputationGraph *cg,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *batch_ids)

{
  pointer puVar1;
  pointer ppNVar2;
  InputNode *this_00;
  long lVar3;
  long lVar4;
  initializer_list<unsigned_int> x;
  uint local_5c;
  vector<float,_std::allocator<float>_> values;
  Dim local_3c;
  
  std::vector<float,_std::allocator<float>_>::vector
            (&values,(long)(batch_ids->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(batch_ids->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_3c);
  puVar1 = (batch_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(batch_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  ppNVar2 = (cg->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 1) {
    values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar3] = **(float **)((long)ppNVar2[puVar1[lVar3]][1].dim.d + 8);
  }
  this_00 = (InputNode *)operator_new(0xa8);
  local_5c = 1;
  x._M_len = 1;
  x._M_array = &local_5c;
  Dim::Dim(&local_3c,x,(uint)lVar4);
  InputNode::InputNode(this_00,&local_3c,&values);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&values.super__Vector_base<float,_std::allocator<float>_>);
  return &this_00->super_Node;
}

Assistant:

Node* ScalarInputNode::autobatch_pseudo_node(const ComputationGraph & cg,
                                             const std::vector<VariableIndex> & batch_ids) const {
  vector<float> values(batch_ids.size());
  ScalarInputNode* sin;
  for(size_t i = 0; i < batch_ids.size(); ++i) {
    sin = static_cast<ScalarInputNode*>(cg.nodes[batch_ids[i]]);
    values[i] = *sin->pdata;
  }
  return new InputNode(Dim({1}, batch_ids.size()), values);
}